

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetComponentType
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  Op OVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  uint32_t kArrayElementInIdx;
  Instruction *agg_type_inst;
  DefUseManager *def_use_mgr;
  uint32_t agg_type_id_local;
  uint32_t index_local;
  LivenessManager *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_def_use_mgr(this_00);
  this_02 = DefUseManager::GetDef(this_01,agg_type_id);
  OVar1 = opt::Instruction::opcode(this_02);
  if ((OVar1 - OpTypeVector < 2) || (OVar1 == OpTypeArray)) {
    this_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this_02,0);
  }
  else {
    if (OVar1 != OpTypeStruct) {
      __assert_fail("false && \"unexpected aggregate type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp"
                    ,0x8c,
                    "uint32_t spvtools::opt::analysis::LivenessManager::GetComponentType(uint32_t, uint32_t) const"
                   );
    }
    this_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this_02,index);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t LivenessManager::GetComponentType(uint32_t index,
                                           uint32_t agg_type_id) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* agg_type_inst = def_use_mgr->GetDef(agg_type_id);

  const uint32_t kArrayElementInIdx = 0;
  switch (agg_type_inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      return agg_type_inst->GetSingleWordInOperand(kArrayElementInIdx);
    case spv::Op::OpTypeStruct:
      return agg_type_inst->GetSingleWordInOperand(index);
    default:
      assert(false && "unexpected aggregate type");
      return 0;
  }
}